

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Separator(void)

{
  ImGuiSeparatorFlags flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiSeparatorFlags in_stack_000000a4;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    SeparatorEx(in_stack_000000a4);
  }
  return;
}

Assistant:

void ImGui::Separator()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // Those flags should eventually be overridable by the user
    ImGuiSeparatorFlags flags = (window->DC.LayoutType == ImGuiLayoutType_Horizontal) ? ImGuiSeparatorFlags_Vertical : ImGuiSeparatorFlags_Horizontal;
    flags |= ImGuiSeparatorFlags_SpanAllColumns;
    SeparatorEx(flags);
}